

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O1

int AF_AActor_A_DeQueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  _func_int **pp_Var1;
  PClass *pPVar2;
  _func_int *p_Var3;
  PClass *pPVar4;
  DThinker *pDVar5;
  _func_int **pp_Var6;
  char *__assertion;
  bool bVar7;
  TThinkerIterator<DCorpsePointer> iterator;
  FThinkerIterator FStack_28;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pp_Var1 = (_func_int **)(param->field_0).field_1.a;
      if (pp_Var1 != (_func_int **)0x0) {
        if (pp_Var1[1] == (_func_int *)0x0) {
          p_Var3 = (_func_int *)(**(code **)*pp_Var1)(pp_Var1);
          pp_Var1[1] = p_Var3;
        }
        pPVar4 = (PClass *)pp_Var1[1];
        bVar7 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar7) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar7 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b48b8;
        }
      }
      FThinkerIterator::FThinkerIterator(&FStack_28,DCorpsePointer::RegistrationInfo.MyClass,3);
      do {
        pDVar5 = FThinkerIterator::Next(&FStack_28,false);
        if (pDVar5 == (DThinker *)0x0) {
          return 0;
        }
        pp_Var6 = pDVar5[1].super_DObject._vptr_DObject;
        if ((pp_Var6 != (_func_int **)0x0) && (((ulong)pp_Var6[4] & 0x20) != 0)) {
          pDVar5[1].super_DObject._vptr_DObject = (_func_int **)0x0;
          pp_Var6 = (_func_int **)0x0;
        }
      } while (pp_Var6 != pp_Var1);
      pDVar5[1].super_DObject._vptr_DObject = (_func_int **)0x0;
      (*(pDVar5->super_DObject)._vptr_DObject[4])(pDVar5);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004b48b8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x142,
                "int AF_AActor_A_DeQueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_DeQueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *corpsePtr;

	while ((corpsePtr = iterator.Next()) != NULL)
	{
		if (corpsePtr->Corpse == self)
		{
			corpsePtr->Corpse = NULL;
			corpsePtr->Destroy ();
			return 0;
		}
	}
	return 0;
}